

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

bool Jinx::Impl::StringToNumber(String *value,double *outValue,NumericFormat format)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  locale local_3d8 [15];
  allocator<char> local_3c9;
  string local_3c8 [32];
  istringstream local_3a8 [8];
  istringstream istr_1;
  locale local_220 [15];
  allocator<char> local_211;
  string local_210 [32];
  istringstream local_1f0 [8];
  istringstream istr;
  char local_5a [2];
  char *local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
  local_50;
  undefined1 local_48 [8];
  String s;
  NumericFormat format_local;
  double *outValue_local;
  String *value_local;
  
  s.field_2._12_4_ = format;
  if (outValue != (double *)0x0) {
    if (format == Continental) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
                ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_48,
                 value);
      local_50._M_current =
           (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                   ::begin((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                           local_48);
      local_58 = (char *)std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::end
                                   ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                     *)local_48);
      local_5a[1] = 0x2c;
      local_5a[0] = '.';
      std::
      replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>,char>
                (local_50,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
                           )local_58,local_5a + 1,local_5a);
      pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_48)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_210,pcVar2,&local_211);
      std::__cxx11::istringstream::istringstream(local_1f0,local_210,8);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      std::locale::classic();
      std::ios::imbue(local_220);
      std::locale::~locale(local_220);
      std::istream::operator>>((istream *)local_1f0,outValue);
      bVar1 = std::ios::fail();
      bVar3 = (bVar1 & 1) != 0;
      if (bVar3) {
        value_local._7_1_ = 0;
      }
      std::__cxx11::istringstream::~istringstream(local_1f0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_48);
    }
    else {
      pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
               c_str(value);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_3c8,pcVar2,&local_3c9);
      std::__cxx11::istringstream::istringstream(local_3a8,local_3c8,8);
      std::__cxx11::string::~string(local_3c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
      std::locale::classic();
      std::ios::imbue(local_3d8);
      std::locale::~locale(local_3d8);
      std::istream::operator>>((istream *)local_3a8,outValue);
      bVar1 = std::ios::fail();
      bVar3 = (bVar1 & 1) != 0;
      if (bVar3) {
        value_local._7_1_ = 0;
      }
      std::__cxx11::istringstream::~istringstream(local_3a8);
    }
    if (!bVar3) {
      value_local._7_1_ = 1;
    }
    return (bool)(value_local._7_1_ & 1);
  }
  __assert_fail("outValue",
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/UnitTests/../../Include/Jinx.hpp"
                ,0xd3c,"bool Jinx::Impl::StringToNumber(const String &, double *, NumericFormat)");
}

Assistant:

inline bool StringToNumber(const String & value, double * outValue, NumericFormat format)
	{
		assert(outValue);
#ifdef JINX_USE_FROM_CHARS
		// In case contintental format is used, replace commas with decimal point
		if (format == NumericFormat::Continental)
		{
			String s = value;
			std::replace(s.begin(), s.end(), ',', '.');
			auto result = std::from_chars(s.data(), s.data() + s.size(), *outValue);
			if (result.ptr == s.data() + s.size())
				return true;
		}
		else
		{
			auto result = std::from_chars(value.data(), value.data() + value.size(), *outValue);
			if (result.ptr == value.data() + value.size())
				return true;
		}
		return false;
#else
		// In case contintental format is used, replace commas with decimal point
		if (format == NumericFormat::Continental)
		{
			String s = value;
			std::replace(s.begin(), s.end(), ',', '.');
			std::istringstream istr(s.c_str());
			istr.imbue(std::locale::classic());
			istr >> *outValue;
			if (istr.fail())
				return false;
		}
		else
		{
			std::istringstream istr(value.c_str());
			istr.imbue(std::locale::classic());
			istr >> *outValue;
			if (istr.fail())
				return false;
		}
		return true;
#endif
	}